

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O0

bool __thiscall QProcess::startDetached(QProcess *this,qint64 *pid)

{
  bool bVar1;
  QProcessPrivate *s;
  long in_FS_OFFSET;
  qint64 *in_stack_00000028;
  QProcessPrivate *in_stack_00000030;
  QProcessPrivate *d;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  char *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 uVar2;
  bool local_41;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  s = d_func((QProcess *)0x7927b0);
  if (s->processState == '\0') {
    bVar1 = QString::isEmpty((QString *)0x792807);
    if (bVar1) {
      uVar2 = 0;
      tr((char *)s,(char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
         in_stack_ffffffffffffff6c);
      QProcessPrivate::setErrorAndEmit
                ((QProcessPrivate *)CONCAT44(uVar2,in_stack_ffffffffffffff80),
                 (ProcessError)((ulong)s >> 0x20),
                 (QString *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      QString::~QString((QString *)0x792859);
      local_41 = false;
    }
    else {
      local_41 = QProcessPrivate::startDetached(in_stack_00000030,in_stack_00000028);
    }
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
               (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    QMessageLogger::warning(&local_28,"QProcess::startDetached: Process is already running");
    local_41 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_41;
  }
  __stack_chk_fail();
}

Assistant:

bool QProcess::startDetached(qint64 *pid)
{
    Q_D(QProcess);
    if (d->processState != NotRunning) {
        qWarning("QProcess::startDetached: Process is already running");
        return false;
    }
    if (d->program.isEmpty()) {
        d->setErrorAndEmit(QProcess::FailedToStart, tr("No program defined"));
        return false;
    }
    return d->startDetached(pid);
}